

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

int Curl_single_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *sock)

{
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  
  UNRECOVERED_JUMPTABLE = conn->handler->perform_getsock;
  if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(data,conn,sock);
    return iVar1;
  }
  uVar5 = (data->req).keepon;
  uVar3 = uVar5 & 0x15;
  if (uVar3 == 1) {
    *sock = conn->sockfd;
    uVar5 = (data->req).keepon;
  }
  uVar2 = (uint)(uVar3 == 1);
  if ((uVar5 & 0x2a) == 2) {
    if ((uVar3 != 1) || (bVar4 = 0x10, conn->sockfd != conn->writesockfd)) {
      sock[uVar3 == 1] = conn->writesockfd;
      bVar4 = uVar3 == 1 | 0x10;
    }
    uVar2 = uVar2 | 1 << bVar4;
  }
  return uVar2;
}

Assistant:

int Curl_single_getsock(struct Curl_easy *data,
                        struct connectdata *conn,
                        curl_socket_t *sock)
{
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(data, conn, sock);

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       bitmap == GETSOCK_BLANK) {
      /* only if they are not the same socket and we have a readable
         one, we increase index */
      if(bitmap != GETSOCK_BLANK)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}